

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

void UpnpThreadDistribution(UpnpNonblockParam *Param)

{
  UpnpClient_Handle UVar1;
  int n;
  UpnpString *pUVar2;
  char *pcStack_60;
  int errCode_2;
  char *currentVal;
  UpnpStateVarComplete *Evt_1;
  IXML_Document *pIStack_48;
  int errCode_1;
  IXML_Document *actionResult;
  UpnpActionComplete *Evt;
  UpnpEventSubscribe *evt_2;
  UpnpEventSubscribe *evt_1;
  UpnpString *Sid;
  UpnpEventSubscribe *evt;
  job_arg *pjStack_10;
  int errCode;
  UpnpNonblockParam *Param_local;
  
  evt._4_4_ = 0;
  pjStack_10 = (job_arg *)Param;
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xfb8,"Inside UpnpThreadDistribution \n");
  switch((pjStack_10->advertise).handle) {
  case 0:
    Sid = (UpnpString *)UpnpEventSubscribe_new();
    evt_1 = (UpnpEventSubscribe *)UpnpString_new();
    UpnpEventSubscribe_strcpy_PublisherUrl((UpnpEventSubscribe *)Sid,(pjStack_10->action).Url);
    UVar1 = (pjStack_10->advertise).eventId;
    pUVar2 = UpnpEventSubscribe_get_PublisherUrl((UpnpEventSubscribe *)Sid);
    evt._4_4_ = genaSubscribe(UVar1,pUVar2,&(pjStack_10->action).TimeOut,(UpnpString *)evt_1);
    UpnpEventSubscribe_set_ErrCode((UpnpEventSubscribe *)Sid,evt._4_4_);
    UpnpEventSubscribe_set_TimeOut((UpnpEventSubscribe *)Sid,(pjStack_10->action).TimeOut);
    UpnpEventSubscribe_set_SID((UpnpEventSubscribe *)Sid,(UpnpString *)evt_1);
    (*(pjStack_10->action).Fun)(UPNP_EVENT_SUBSCRIBE_COMPLETE,Sid,(pjStack_10->action).Cookie);
    UpnpString_delete((UpnpString *)evt_1);
    UpnpEventSubscribe_delete((UpnpEventSubscribe *)Sid);
    free(pjStack_10);
    break;
  case 1:
    evt_2 = UpnpEventSubscribe_new();
    UpnpEventSubscribe_strcpy_SID(evt_2,(pjStack_10->action).SubsId);
    UVar1 = (pjStack_10->advertise).eventId;
    pUVar2 = UpnpEventSubscribe_get_SID(evt_2);
    evt._4_4_ = genaUnSubscribe(UVar1,pUVar2);
    UpnpEventSubscribe_set_ErrCode(evt_2,evt._4_4_);
    UpnpEventSubscribe_strcpy_PublisherUrl(evt_2,"");
    UpnpEventSubscribe_set_TimeOut(evt_2,0);
    (*(pjStack_10->action).Fun)(UPNP_EVENT_UNSUBSCRIBE_COMPLETE,evt_2,(pjStack_10->action).Cookie);
    UpnpEventSubscribe_delete(evt_2);
    free(pjStack_10);
    break;
  default:
    break;
  case 4:
    actionResult = (IXML_Document *)UpnpActionComplete_new();
    pIStack_48 = (IXML_Document *)0x0;
    if ((pjStack_10->action).Header == (IXML_Document *)0x0) {
      Evt_1._4_4_ = SoapSendAction((pjStack_10->action).Url,(pjStack_10->action).ServiceType,
                                   (pjStack_10->action).Act,&stack0xffffffffffffffb8);
    }
    else {
      Evt_1._4_4_ = SoapSendActionEx((pjStack_10->action).Url,(pjStack_10->action).ServiceType,
                                     (pjStack_10->action).Header,(pjStack_10->action).Act,
                                     &stack0xffffffffffffffb8);
    }
    UpnpActionComplete_set_ErrCode((UpnpActionComplete *)actionResult,Evt_1._4_4_);
    UpnpActionComplete_set_ActionRequest
              ((UpnpActionComplete *)actionResult,(pjStack_10->action).Act);
    UpnpActionComplete_set_ActionResult((UpnpActionComplete *)actionResult,pIStack_48);
    UpnpActionComplete_strcpy_CtrlUrl((UpnpActionComplete *)actionResult,(pjStack_10->action).Url);
    (*(pjStack_10->action).Fun)
              (UPNP_CONTROL_ACTION_COMPLETE,actionResult,(pjStack_10->action).Cookie);
    UpnpActionComplete_delete((UpnpActionComplete *)actionResult);
    ixmlDocument_free(pIStack_48);
    free_action_arg(pjStack_10);
    break;
  case 5:
    currentVal = (char *)UpnpStateVarComplete_new();
    pcStack_60 = (char *)0x0;
    n = SoapGetServiceVarStatus
                  ((pjStack_10->action).Url,(pjStack_10->action).VarName,&stack0xffffffffffffffa0);
    UpnpStateVarComplete_set_ErrCode((UpnpStateVarComplete *)currentVal,n);
    UpnpStateVarComplete_strcpy_CtrlUrl((UpnpStateVarComplete *)currentVal,(pjStack_10->action).Url)
    ;
    UpnpStateVarComplete_strcpy_StateVarName
              ((UpnpStateVarComplete *)currentVal,(pjStack_10->action).VarName);
    UpnpStateVarComplete_set_CurrentVal((UpnpStateVarComplete *)currentVal,pcStack_60);
    (*(pjStack_10->action).Fun)
              (UPNP_CONTROL_GET_VAR_COMPLETE,currentVal,(pjStack_10->action).Cookie);
    free(pjStack_10);
    UpnpStateVarComplete_delete((UpnpStateVarComplete *)currentVal);
    break;
  case 9:
    Evt = (UpnpActionComplete *)UpnpEventSubscribe_new();
    UpnpEventSubscribe_strcpy_SID((UpnpEventSubscribe *)Evt,(pjStack_10->action).SubsId);
    UVar1 = (pjStack_10->advertise).eventId;
    pUVar2 = UpnpEventSubscribe_get_SID((UpnpEventSubscribe *)Evt);
    evt._4_4_ = genaRenewSubscription(UVar1,pUVar2,&(pjStack_10->action).TimeOut);
    UpnpEventSubscribe_set_ErrCode((UpnpEventSubscribe *)Evt,evt._4_4_);
    UpnpEventSubscribe_set_TimeOut((UpnpEventSubscribe *)Evt,(pjStack_10->action).TimeOut);
    (*(pjStack_10->action).Fun)(UPNP_EVENT_RENEWAL_COMPLETE,Evt,(pjStack_10->action).Cookie);
    UpnpEventSubscribe_delete((UpnpEventSubscribe *)Evt);
    free(pjStack_10);
  }
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x101b,"Exiting UpnpThreadDistribution\n");
  return;
}

Assistant:

void UpnpThreadDistribution(struct UpnpNonblockParam *Param)
{
	int errCode = 0;

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpThreadDistribution \n");

	switch (Param->FunName) {
	#if EXCLUDE_GENA == 0
	case SUBSCRIBE: {
		UpnpEventSubscribe *evt = UpnpEventSubscribe_new();
		UpnpString *Sid = UpnpString_new();

		UpnpEventSubscribe_strcpy_PublisherUrl(evt, Param->Url);
		errCode = genaSubscribe(Param->Handle,
			UpnpEventSubscribe_get_PublisherUrl(evt),
			(int *)&Param->TimeOut,
			Sid);
		UpnpEventSubscribe_set_ErrCode(evt, errCode);
		UpnpEventSubscribe_set_TimeOut(evt, Param->TimeOut);
		UpnpEventSubscribe_set_SID(evt, Sid);
		Param->Fun(UPNP_EVENT_SUBSCRIBE_COMPLETE, evt, Param->Cookie);
		UpnpString_delete(Sid);
		UpnpEventSubscribe_delete(evt);
		free(Param);
		break;
	}
	case UNSUBSCRIBE: {
		UpnpEventSubscribe *evt = UpnpEventSubscribe_new();
		UpnpEventSubscribe_strcpy_SID(evt, Param->SubsId);
		errCode = genaUnSubscribe(
			Param->Handle, UpnpEventSubscribe_get_SID(evt));
		UpnpEventSubscribe_set_ErrCode(evt, errCode);
		UpnpEventSubscribe_strcpy_PublisherUrl(evt, "");
		UpnpEventSubscribe_set_TimeOut(evt, 0);
		Param->Fun(UPNP_EVENT_UNSUBSCRIBE_COMPLETE, evt, Param->Cookie);
		UpnpEventSubscribe_delete(evt);
		free(Param);
		break;
	}
	case RENEW: {
		UpnpEventSubscribe *evt = UpnpEventSubscribe_new();
		UpnpEventSubscribe_strcpy_SID(evt, Param->SubsId);
		errCode = genaRenewSubscription(Param->Handle,
			UpnpEventSubscribe_get_SID(evt),
			&Param->TimeOut);
		UpnpEventSubscribe_set_ErrCode(evt, errCode);
		UpnpEventSubscribe_set_TimeOut(evt, Param->TimeOut);
		Param->Fun(UPNP_EVENT_RENEWAL_COMPLETE, evt, Param->Cookie);
		UpnpEventSubscribe_delete(evt);
		free(Param);
		break;
	}
	#endif /* EXCLUDE_GENA == 0 */
	#if EXCLUDE_SOAP == 0
	case ACTION: {
		UpnpActionComplete *Evt = UpnpActionComplete_new();
		IXML_Document *actionResult = NULL;
		int errCode;
		if (Param->Header) {
			errCode = SoapSendActionEx(Param->Url,
				Param->ServiceType,
				Param->Header,
				Param->Act,
				&actionResult);
		} else {
			errCode = SoapSendAction(Param->Url,
				Param->ServiceType,
				Param->Act,
				&actionResult);
		}
		UpnpActionComplete_set_ErrCode(Evt, errCode);
		UpnpActionComplete_set_ActionRequest(Evt, Param->Act);
		UpnpActionComplete_set_ActionResult(Evt, actionResult);
		UpnpActionComplete_strcpy_CtrlUrl(Evt, Param->Url);
		Param->Fun(UPNP_CONTROL_ACTION_COMPLETE, Evt, Param->Cookie);
		UpnpActionComplete_delete(Evt);
		ixmlDocument_free(actionResult);
		free_action_arg((job_arg *)Param);
		break;
	}
	case STATUS: {
		UpnpStateVarComplete *Evt = UpnpStateVarComplete_new();
		DOMString currentVal = NULL;
		int errCode = SoapGetServiceVarStatus(
			Param->Url, Param->VarName, &currentVal);
		UpnpStateVarComplete_set_ErrCode(Evt, errCode);
		UpnpStateVarComplete_strcpy_CtrlUrl(Evt, Param->Url);
		UpnpStateVarComplete_strcpy_StateVarName(Evt, Param->VarName);
		UpnpStateVarComplete_set_CurrentVal(Evt, currentVal);
		Param->Fun(UPNP_CONTROL_GET_VAR_COMPLETE, Evt, Param->Cookie);
		free(Param);
		UpnpStateVarComplete_delete(Evt);
		break;
	}
	#endif /* EXCLUDE_SOAP == 0 */
	default:
		break;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpThreadDistribution\n");
}